

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecMult.c
# Opt level: O3

uint Extra_TruthCanonNPN2(uint uTruth,int nVars,Vec_Int_t *vRes)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  long lVar5;
  int Polarity;
  uint uVar6;
  long lVar7;
  
  if (Extra_TruthCanonNPN2::pPerms != (char **)0x0) {
    if (Extra_TruthCanonNPN2::nVarsOld == nVars) goto LAB_0067e7d6;
    free(Extra_TruthCanonNPN2::pPerms);
    Extra_TruthCanonNPN2::pPerms = (char **)0x0;
  }
  Extra_TruthCanonNPN2::nPerms = Extra_Factorial(nVars);
  Extra_TruthCanonNPN2::pPerms = Extra_Permutations(nVars);
  Extra_TruthCanonNPN2::nVarsOld = nVars;
LAB_0067e7d6:
  iVar2 = 1 << ((byte)nVars & 0x1f);
  uVar6 = 0xffffffff;
  if (nVars != 0x1f) {
    iVar1 = 1;
    if (1 < iVar2) {
      iVar1 = iVar2;
    }
    Polarity = 0;
    do {
      uVar3 = Extra_TruthPolarize(uTruth,Polarity,nVars);
      if (0 < Extra_TruthCanonNPN2::nPerms) {
        lVar7 = 0;
        do {
          uVar4 = Extra_TruthPermute(uVar3,Extra_TruthCanonNPN2::pPerms[lVar7],nVars,0);
          if ((uVar4 & 1) == 0) {
            if (0 < (long)vRes->nSize) {
              lVar5 = 0;
              do {
                if (vRes->pArray[lVar5] == uVar4) goto LAB_0067e87f;
                lVar5 = lVar5 + 1;
              } while (vRes->nSize != lVar5);
            }
            Vec_IntPush(vRes,uVar4);
          }
LAB_0067e87f:
          if (uVar4 <= uVar6) {
            uVar6 = uVar4;
          }
          lVar7 = lVar7 + 1;
        } while (lVar7 < Extra_TruthCanonNPN2::nPerms);
      }
      uVar3 = Extra_TruthPolarize((~uTruth << (-(char)iVar2 & 0x1fU)) >> (-(char)iVar2 & 0x1fU),
                                  Polarity,nVars);
      if (0 < Extra_TruthCanonNPN2::nPerms) {
        lVar7 = 0;
        do {
          uVar4 = Extra_TruthPermute(uVar3,Extra_TruthCanonNPN2::pPerms[lVar7],nVars,0);
          if ((uVar4 & 1) == 0) {
            if (0 < (long)vRes->nSize) {
              lVar5 = 0;
              do {
                if (vRes->pArray[lVar5] == uVar4) goto LAB_0067e8fc;
                lVar5 = lVar5 + 1;
              } while (vRes->nSize != lVar5);
            }
            Vec_IntPush(vRes,uVar4);
          }
LAB_0067e8fc:
          if (uVar4 <= uVar6) {
            uVar6 = uVar4;
          }
          lVar7 = lVar7 + 1;
        } while (lVar7 < Extra_TruthCanonNPN2::nPerms);
      }
      Polarity = Polarity + 1;
    } while (Polarity != iVar1);
  }
  return uVar6;
}

Assistant:

unsigned Extra_TruthCanonNPN2( unsigned uTruth, int nVars, Vec_Int_t * vRes )
{
    static int nVarsOld, nPerms;
    static char ** pPerms = NULL;

    unsigned uTruthMin, uTruthC, uPhase, uPerm;
    int nMints, k, i;

    if ( pPerms == NULL )
    {
        nPerms = Extra_Factorial( nVars );   
        pPerms = Extra_Permutations( nVars );
        nVarsOld = nVars;
    }
    else if ( nVarsOld != nVars )
    {
        ABC_FREE( pPerms );
        nPerms = Extra_Factorial( nVars );   
        pPerms = Extra_Permutations( nVars );
        nVarsOld = nVars;
    }

    nMints    = (1 << nVars);
    uTruthC   = (unsigned)( (~uTruth) & ((~((unsigned)0)) >> (32-nMints)) );
    uTruthMin = 0xFFFFFFFF;
    for ( i = 0; i < nMints; i++ )
    {
        uPhase = Extra_TruthPolarize( uTruth, i, nVars ); 
        for ( k = 0; k < nPerms; k++ )
        {
            uPerm = Extra_TruthPermute( uPhase, pPerms[k], nVars, 0 );
            if ( !(uPerm & 1) )
            Vec_IntPushUnique( vRes, uPerm );
            if ( uTruthMin > uPerm )
                uTruthMin = uPerm;
        }
        uPhase = Extra_TruthPolarize( uTruthC, i, nVars ); 
        for ( k = 0; k < nPerms; k++ )
        {
            uPerm = Extra_TruthPermute( uPhase, pPerms[k], nVars, 0 );
            if ( !(uPerm & 1) )
            Vec_IntPushUnique( vRes, uPerm );
            if ( uTruthMin > uPerm )
                uTruthMin = uPerm;
        }
    }
    return uTruthMin;
}